

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O0

int Bmc_PerformISearchOne
              (Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fVerbose,
              Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Gia_Man_t *p1;
  Gia_Man_t *p_00;
  Cnf_Dat_t *pCnf_00;
  sat_solver *s;
  int *piVar9;
  int *piVar10;
  abctime aVar11;
  abctime clkStart;
  uint local_68;
  int RetValue;
  int nLitsUsed;
  int status;
  int Iter;
  int i;
  Vec_Int_t *vRegs;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pTemp;
  Gia_Man_t *pMiter;
  int fUseOldCnf;
  int fVerbose_local;
  int fBackTopo_local;
  int fReverse_local;
  int nTimeOut_local;
  int nFramesMax_local;
  Gia_Man_t *p_local;
  
  _Iter = (Vec_Int_t *)0x0;
  clkStart._4_4_ = 0;
  aVar8 = Abc_Clock();
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x17d,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x17e,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  p1 = Gia_ManDup(p);
  p_00 = Gia_ManMiter(p,p1,0,1,1,0,0);
  Gia_ManStop(p1);
  iVar1 = Gia_ManPoNum(p_00);
  iVar2 = Gia_ManPoNum(p);
  if (iVar1 != iVar2 * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x184,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  iVar1 = Gia_ManRegNum(p_00);
  iVar2 = Gia_ManRegNum(p);
  if (iVar1 != iVar2 * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x185,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  pCnf_00 = Mf_ManGenerateCnf(p_00,8,0,0,0);
  s = Bmc_DeriveSolver(p,p_00,pCnf_00,nFramesMax,nTimeOut,fVerbose);
  piVar9 = Vec_IntArray(vLits);
  piVar10 = Vec_IntArray(vLits);
  iVar1 = Vec_IntSize(vLits);
  iVar1 = sat_solver_solve(s,piVar9,piVar10 + iVar1,0,0,0,0);
  if (iVar1 == 1) {
    printf("I = %4d :  ",(ulong)(uint)nFramesMax);
    printf("Problem is satisfiable.\n");
    sat_solver_delete(s);
    Cnf_DataFree(pCnf_00);
    Gia_ManStop(p_00);
    p_local._4_4_ = 1;
  }
  else {
    if (iVar1 == 0) {
      printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
             ,(ulong)(uint)nTimeOut);
      clkStart._4_4_ = 1;
    }
    else {
      if (iVar1 != -1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                      ,0x1a9,
                      "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                     );
      }
      local_68 = 0;
      for (status = 0; iVar1 = Gia_ManRegNum(p), status < iVar1; status = status + 1) {
        iVar1 = Vec_IntEntry(vLits,status);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 == 0) {
          local_68 = local_68 + 1;
        }
      }
      iVar1 = Gia_ManRegNum(p);
      _Iter = Vec_IntStartNatural(iVar1);
      if (fBackTopo != 0) {
        Bmc_PerformFindFlopOrder(p,_Iter);
      }
      if (fReverse != 0) {
        Vec_IntReverseOrder(_Iter);
      }
      for (nLitsUsed = 0; iVar1 = Vec_IntSize(_Iter), nLitsUsed < iVar1; nLitsUsed = nLitsUsed + 1)
      {
        uVar3 = Vec_IntEntry(_Iter,nLitsUsed);
        iVar1 = Vec_IntEntry(vLits,uVar3);
        iVar1 = Abc_LitIsCompl(iVar1);
        if (iVar1 == 0) {
          iVar1 = Vec_IntEntry(vLits,uVar3);
          iVar1 = Abc_LitNot(iVar1);
          Vec_IntWriteEntry(vLits,uVar3,iVar1);
          piVar9 = Vec_IntArray(vLits);
          piVar10 = Vec_IntArray(vLits);
          iVar1 = Vec_IntSize(vLits);
          iVar1 = sat_solver_solve(s,piVar9,piVar10 + iVar1,0,0,0,0);
          if (iVar1 == 0) {
            printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
                   ,(ulong)(uint)nTimeOut);
            clkStart._4_4_ = 1;
            goto LAB_0069c6b9;
          }
          if (iVar1 == 1) {
            iVar1 = Vec_IntEntry(vLits,uVar3);
            iVar1 = Abc_LitNot(iVar1);
            Vec_IntWriteEntry(vLits,uVar3,iVar1);
          }
          else {
            if (iVar1 != -1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                            ,0x1c9,
                            "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                           );
            }
            local_68 = local_68 - 1;
          }
          if (fVerbose != 0) {
            iVar1 = Gia_ManAndNum(p_00);
            iVar2 = Gia_ManRegNum(p);
            iVar5 = Gia_ManCoNum(p);
            iVar6 = sat_solver_nvars(s);
            uVar4 = sat_solver_nconflicts(s);
            iVar7 = Gia_ManRegNum(p);
            printf("I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                   ((double)(int)local_68 * 100.0) / (double)iVar7,(ulong)uVar3,
                   (ulong)(uint)((nFramesMax + 1) * iVar1),(ulong)(uint)(iVar2 + iVar5 + iVar6),
                   (ulong)uVar4,(ulong)local_68);
            Abc_Print(1,"%s =","Time");
            aVar11 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\r",((double)(aVar11 - aVar8) * 1.0) / 1000000.0);
            fflush(_stdout);
          }
        }
      }
      if (fVerbose != 0) {
        iVar1 = Gia_ManAndNum(p_00);
        iVar2 = Gia_ManRegNum(p);
        iVar5 = Gia_ManCoNum(p);
        iVar6 = sat_solver_nvars(s);
        uVar3 = sat_solver_nconflicts(s);
        iVar7 = Gia_ManRegNum(p);
        printf("M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
               ((double)(int)local_68 * 100.0) / (double)iVar7,(ulong)(uint)nFramesMax,
               (ulong)(uint)((nFramesMax + 1) * iVar1),(ulong)(uint)(iVar2 + iVar5 + iVar6),
               (ulong)uVar3,(ulong)local_68);
        aVar11 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar11 - aVar8);
        fflush(_stdout);
      }
    }
LAB_0069c6b9:
    sat_solver_delete(s);
    Cnf_DataFree(pCnf_00);
    Gia_ManStop(p_00);
    Vec_IntFree(_Iter);
    p_local._4_4_ = clkStart._4_4_;
  }
  return p_local._4_4_;
}

Assistant:

int Bmc_PerformISearchOne( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fVerbose, Vec_Int_t * vLits )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vRegs = NULL;
//    Vec_Int_t * vLits;
    int i, Iter, status;
    int nLitsUsed, RetValue = 0;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
        //pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        //Gia_ManStop( pTemp );
        //pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
        pCnf = Mf_ManGenerateCnf( pMiter, 8, 0, 0, 0 );
    }
/*
    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
*/
    // derive SAT solver        
    pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_True )
    {
        printf( "I = %4d :  ", nFramesMax );
        printf( "Problem is satisfiable.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        Gia_ManStop( pMiter );
        return 1;
    }
    if ( status == l_Undef )
    {
        printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
        RetValue = 1;
        goto cleanup;
    }
    assert( status == l_False );

    // count the number of positive literals
    nLitsUsed = 0;
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            nLitsUsed++;

    // try removing variables
    vRegs = Vec_IntStartNatural( Gia_ManRegNum(p) );
    if ( fBackTopo )
        Bmc_PerformFindFlopOrder( p, vRegs );
    if ( fReverse )
        Vec_IntReverseOrder( vRegs );
//    for ( Iter = 0; Iter < Gia_ManRegNum(p); Iter++ )
    Vec_IntForEachEntry( vRegs, i, Iter )
    {
//        i = fReverse ? Gia_ManRegNum(p) - 1 - Iter : Iter;
        if ( Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            continue;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
            RetValue = 1;
            goto cleanup;
        }
        if ( status == l_True )
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        else if ( status == l_False )
            nLitsUsed--;
        else assert( 0 );
        // report the results
        //printf( "Round %d:  ", o );
        if ( fVerbose )
        {
            printf( "I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                i, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
                Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
                sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
            ABC_PRTr( "Time", Abc_Clock() - clkStart );
            fflush( stdout );
        }
    }
    // report the results
    //printf( "Round %d:  ", o );
    if ( fVerbose )
    {
        printf( "M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        fflush( stdout );
    }
cleanup:
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vRegs );
//    Vec_IntFree( vLits );
    return RetValue;
}